

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::SwapChainVkImpl::CreateVulkanSwapChain(SwapChainVkImpl *this)

{
  uint uVar1;
  VkSurfaceKHR pVVar2;
  VkSwapchainKHR pVVar3;
  undefined *puVar4;
  PFN_vkGetPhysicalDeviceSurfaceFormatsKHR p_Var5;
  PFN_vkGetPhysicalDeviceSurfacePresentModesKHR p_Var6;
  VkDevice pVVar7;
  VkPhysicalDevice pVVar8;
  VulkanPhysicalDevice *pVVar9;
  bool bVar10;
  bool bVar11;
  TEXTURE_FORMAT Format;
  VkResult VVar12;
  VkFormat VVar13;
  SURFACE_TRANSFORM SVar14;
  Char *pCVar15;
  ulong uVar16;
  VkSurfaceFormatKHR *pVVar17;
  char (*pacVar18) [39];
  char (*Args_1) [39];
  reference pvVar19;
  reference pVVar20;
  TextureFormatAttribs *pTVar21;
  VkPresentModeKHR *pVVar22;
  char (*pacVar23) [164];
  char (*Args_1_00) [164];
  undefined8 uVar24;
  uint *puVar25;
  reference pVVar26;
  ostream *poVar27;
  char *pcVar28;
  ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
  **ppMVar29;
  char (*Args_1_01) [16];
  char (*Args_1_02) [21];
  char (*Args_1_03) [24];
  char *in_R8;
  char *in_R9;
  char (*in_stack_fffffffffffff5b8) [71];
  uint *in_stack_fffffffffffff5c0;
  DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  local_828;
  undefined1 local_818 [8];
  SemaphoreWrapper Semaphore_1;
  string Name_1;
  stringstream ss_1;
  ostream local_7d0 [376];
  DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  local_658;
  undefined1 local_648 [8];
  SemaphoreWrapper Semaphore;
  string Name;
  stringstream ss;
  ostream local_600 [376];
  undefined1 auStack_488 [8];
  VkSemaphoreCreateInfo SemaphoreCI;
  undefined1 local_468 [4];
  uint32_t i_1;
  string _msg_7;
  string msg_5;
  uint32_t local_41c;
  char *pcStack_418;
  uint32_t swapchainImageCount;
  VkDevice local_410;
  VkDevice vkDevice;
  VulkanLogicalDevice *LogicalDevice;
  string msg_4;
  VkSwapchainCreateInfoKHR swapchain_ci;
  VkSwapchainKHR oldSwapchain;
  VkCompositeAlphaFlagBitsKHR VStack_368;
  uint32_t i;
  VkCompositeAlphaFlagBitsKHR compositeAlphaFlags [4];
  VkCompositeAlphaFlagBitsKHR compositeAlpha;
  uint32_t desiredNumberOfSwapChainImages;
  string _msg_6;
  string _msg_5;
  string _msg_4;
  char *PresentModeName;
  VkPresentModeKHR *local_2e0;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  local_2d8;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  local_2d0;
  VkPresentModeKHR local_2c4;
  iterator iStack_2c0;
  VkPresentModeKHR PreferredMode;
  iterator __end2_1;
  iterator __begin2_1;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *__range2_1;
  value_type local_2a0 [4];
  undefined1 local_290 [8];
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> PreferredPresentModes;
  uint local_270;
  VkPresentModeKHR PresentMode;
  uint32_t local_268;
  uint uStack_264;
  VkExtent2D swapchainExtent;
  undefined1 local_258 [8];
  string _msg_3;
  undefined1 local_230 [8];
  string _msg_2;
  undefined1 local_208 [4];
  VkSurfaceTransformFlagBitsKHR vkPreTransform;
  string msg_3;
  allocator<VkPresentModeKHR> local_1d9;
  undefined1 local_1d8 [8];
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> presentModes;
  string msg_2;
  uint32_t local_194;
  char *pcStack_190;
  uint32_t presentModeCount;
  undefined1 auStack_188 [8];
  VkSurfaceCapabilitiesKHR surfCapabilities;
  undefined1 local_148 [8];
  string _msg_1;
  string _msg;
  TEXTURE_FORMAT NewColorBufferFormat;
  VkSurfaceFormatKHR *SrfFmt_1;
  iterator __end3;
  iterator __begin3;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range3;
  bool ReplacementFmtFound;
  VkFormat VkReplacementColorFormat;
  VkSurfaceFormatKHR *SrfFmt;
  iterator __end2;
  iterator __begin2;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range2;
  undefined1 local_b0 [3];
  bool FmtFound;
  VkColorSpaceKHR ColorSpace;
  string msg_1;
  allocator<VkSurfaceFormatKHR> local_81;
  undefined1 local_80 [8];
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> SupportedFormats;
  undefined1 local_58 [8];
  string msg;
  uint32_t local_2c;
  VkResult err;
  uint32_t formatCount;
  VkPhysicalDevice vkDeviceHandle;
  VulkanPhysicalDevice *PhysicalDevice;
  RenderDeviceVkImpl *pRenderDeviceVk;
  SwapChainVkImpl *this_local;
  
  pRenderDeviceVk = (RenderDeviceVkImpl *)this;
  PhysicalDevice =
       (VulkanPhysicalDevice *)
       RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                 (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  vkDeviceHandle =
       (VkPhysicalDevice)RenderDeviceVkImpl::GetPhysicalDevice((RenderDeviceVkImpl *)PhysicalDevice)
  ;
  _err = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle
                   ((VulkanPhysicalDevice *)vkDeviceHandle);
  local_2c = 0;
  Args_1_01 = (char (*) [16])0x0;
  VVar12 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (_err,this->m_VkSurface,&local_2c,(VkSurfaceFormatKHR *)0x0);
  if (VVar12 != VK_SUCCESS) {
    msg.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar12);
    Args_1_01 = (char (*) [16])0xac;
    in_R8 = "Failed to query number of supported formats";
    in_R9 = "\nVK Error Code: ";
    in_stack_fffffffffffff5b8 = (char (*) [71])((long)&msg.field_2 + 8);
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xac,(char (*) [44])"Failed to query number of supported formats",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
  }
  if (local_2c == 0) {
    FormatString<char[26],char[16]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount > 0",Args_1_01);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)local_58);
  }
  uVar16 = (ulong)local_2c;
  std::allocator<VkSurfaceFormatKHR>::allocator(&local_81);
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80,uVar16,
             &local_81);
  std::allocator<VkSurfaceFormatKHR>::~allocator(&local_81);
  pVVar8 = _err;
  p_Var5 = vkGetPhysicalDeviceSurfaceFormatsKHR;
  pVVar2 = this->m_VkSurface;
  pVVar17 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::data
                      ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80);
  VVar12 = (*p_Var5)(pVVar8,pVVar2,&local_2c,pVVar17);
  if (VVar12 != VK_SUCCESS) {
    msg_1.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffff5b8 = (char (*) [71])((long)&msg_1.field_2 + 8);
    in_R8 = "Failed to query supported format properties";
    in_R9 = "\nVK Error Code: ";
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb0,(char (*) [44])"Failed to query supported format properties",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
  }
  pacVar18 = (char (*) [39])(ulong)local_2c;
  Args_1 = (char (*) [39])
           std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size
                     ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80);
  if (pacVar18 != Args_1) {
    FormatString<char[26],char[39]>
              ((string *)local_b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount == SupportedFormats.size()",Args_1);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)local_b0);
  }
  VVar13 = TexFormatToVkFormat((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                               ColorBufferFormat);
  this->m_VkColorFormat = VVar13;
  if (local_2c == 1) {
    pvVar19 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::operator[]
                        ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80
                         ,0);
    if (pvVar19->format == VK_FORMAT_UNDEFINED) goto LAB_0036e829;
  }
  bVar11 = false;
  __end2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::begin
                     ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80);
  SrfFmt = (VkSurfaceFormatKHR *)
           std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::end
                     ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80);
  while (bVar10 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                      *)&SrfFmt), bVar10) {
    pVVar20 = __gnu_cxx::
              __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
              ::operator*(&__end2);
    if (pVVar20->format == this->m_VkColorFormat) {
      bVar11 = true;
      break;
    }
    __gnu_cxx::
    __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
    ::operator++(&__end2);
  }
  if (!bVar11) {
    switch(this->m_VkColorFormat) {
    case VK_FORMAT_R8G8B8A8_UNORM:
      __range3._4_4_ = VK_FORMAT_B8G8R8A8_UNORM;
      break;
    default:
      __range3._4_4_ = VK_FORMAT_UNDEFINED;
      break;
    case VK_FORMAT_R8G8B8A8_SRGB:
      __range3._4_4_ = VK_FORMAT_B8G8R8A8_SRGB;
      break;
    case VK_FORMAT_B8G8R8A8_UNORM:
      __range3._4_4_ = VK_FORMAT_R8G8B8A8_UNORM;
      break;
    case VK_FORMAT_B8G8R8A8_SRGB:
      __range3._4_4_ = VK_FORMAT_R8G8B8A8_SRGB;
    }
    bVar11 = false;
    __end3 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::begin
                       ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80)
    ;
    SrfFmt_1 = (VkSurfaceFormatKHR *)
               std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::end
                         ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                          local_80);
    while( true ) {
      bVar10 = __gnu_cxx::operator!=
                         (&__end3,(__normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                   *)&SrfFmt_1);
      if (!bVar10) break;
      pVVar20 = __gnu_cxx::
                __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                ::operator*(&__end3);
      if (pVVar20->format == __range3._4_4_) {
        bVar11 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
      ::operator++(&__end3);
    }
    if (bVar11) {
      this->m_VkColorFormat = __range3._4_4_;
      Format = VkFormatToTexFormat(__range3._4_4_);
      pTVar21 = GetTextureFormatAttribs
                          ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                           ColorBufferFormat);
      in_R8 = (char *)GetTextureFormatAttribs(Format);
      FormatString<char[31],char_const*,char[60],char_const*>
                ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)"Requested color buffer format ",
                 (char (*) [31])pTVar21,
                 (char **)" is not supported by the surface and will be replaced with ",
                 (char (*) [60])in_R8,(char **)in_R9);
      puVar4 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar24 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar4)(0,uVar24,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.ColorBufferFormat = Format
      ;
    }
    else {
      pTVar21 = GetTextureFormatAttribs
                          ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                           ColorBufferFormat);
      FormatString<char[31],char_const*,char[32]>
                ((string *)local_148,(Diligent *)"Requested color buffer format ",
                 (char (*) [31])pTVar21,(char **)"is not supported by the surface",
                 (char (*) [32])in_R8);
      puVar4 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar24 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar4)(1,uVar24,0);
      }
      std::__cxx11::string::~string((string *)local_148);
    }
  }
LAB_0036e829:
  surfCapabilities.maxImageExtent.width = 0;
  surfCapabilities.maxImageExtent.height = 0;
  surfCapabilities.maxImageArrayLayers = 0;
  surfCapabilities.supportedTransforms = 0;
  surfCapabilities.currentExtent.width = 0;
  surfCapabilities.currentExtent.height = 0;
  surfCapabilities.minImageExtent.width = 0;
  surfCapabilities.minImageExtent.height = 0;
  auStack_188._0_4_ = 0;
  auStack_188._4_4_ = 0;
  surfCapabilities.minImageCount = 0;
  surfCapabilities.maxImageCount = 0;
  surfCapabilities.currentTransform = 0;
  VVar12 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                     (_err,this->m_VkSurface,(VkSurfaceCapabilitiesKHR *)auStack_188);
  if (VVar12 != VK_SUCCESS) {
    pcStack_190 = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffff5b8 = (char (*) [71])&stack0xfffffffffffffe70;
    in_R8 = "Failed to query physical device surface capabilities";
    LogError<true,char[53],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf3,(char (*) [53])"Failed to query physical device surface capabilities",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
  }
  local_194 = 0;
  Args_1_02 = (char (*) [21])0x0;
  VVar12 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (_err,this->m_VkSurface,&local_194,(VkPresentModeKHR *)0x0);
  if (VVar12 != VK_SUCCESS) {
    msg_2.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffff5b8 = (char (*) [71])((long)&msg_2.field_2 + 8);
    in_R8 = "Failed to query surface present mode count";
    Args_1_02 = (char (*) [21])0xf8;
    LogError<true,char[43],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf8,(char (*) [43])"Failed to query surface present mode count",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
  }
  if (local_194 == 0) {
    FormatString<char[26],char[21]>
              ((string *)
               &presentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Diligent *)"Debug expression failed:\n",(char (*) [26])"presentModeCount > 0",
               Args_1_02);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf9);
    std::__cxx11::string::~string
              ((string *)
               &presentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  uVar16 = (ulong)local_194;
  std::allocator<VkPresentModeKHR>::allocator(&local_1d9);
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8,uVar16,
             &local_1d9);
  std::allocator<VkPresentModeKHR>::~allocator(&local_1d9);
  pVVar8 = _err;
  p_Var6 = vkGetPhysicalDeviceSurfacePresentModesKHR;
  pVVar2 = this->m_VkSurface;
  pVVar22 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::data
                      ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8);
  VVar12 = (*p_Var6)(pVVar8,pVVar2,&local_194,pVVar22);
  if (VVar12 != VK_SUCCESS) {
    msg_3.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffff5b8 = (char (*) [71])((long)&msg_3.field_2 + 8);
    in_R8 = "Failed to query surface present modes";
    LogError<true,char[38],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfc,(char (*) [38])"Failed to query surface present modes",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
  }
  pacVar23 = (char (*) [164])(ulong)local_194;
  Args_1_00 = (char (*) [164])
              std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::size
                        ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8);
  if (pacVar23 != Args_1_00) {
    FormatString<char[26],char[40]>
              ((string *)local_208,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount == presentModes.size()",(char (*) [40])Args_1_00);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    Args_1_00 = (char (*) [164])0xfd;
    DebugAssertionFailed
              (pCVar15,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfd);
    std::__cxx11::string::~string((string *)local_208);
  }
  _msg_2.field_2._12_4_ = 1;
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform !=
      SURFACE_TRANSFORM_OPTIMAL) {
    _msg_2.field_2._12_4_ =
         SurfaceTransformToVkSurfaceTransformFlag
                   ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform);
    if ((surfCapabilities.maxImageExtent.height & _msg_2.field_2._12_4_) == 0) {
      _msg_3.field_2._8_8_ =
           GetSurfaceTransformString
                     ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform);
      FormatString<char_const*,char[164]>
                ((string *)local_230,(Diligent *)(_msg_3.field_2._M_local_buf + 8),
                 (char **)
                 " is not supported by the presentation engine. Optimal surface transform will be used instead. Query the swap chain description to get the actual surface transform."
                 ,Args_1_00);
      puVar4 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar24 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar4)(1,uVar24,0);
      }
      std::__cxx11::string::~string((string *)local_230);
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform =
           SURFACE_TRANSFORM_OPTIMAL;
    }
    else {
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform =
           (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
    }
  }
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform ==
      SURFACE_TRANSFORM_OPTIMAL) {
    _msg_2.field_2._12_4_ = surfCapabilities.maxImageArrayLayers;
    SVar14 = VkSurfaceTransformFlagToSurfaceTransform(surfCapabilities.maxImageArrayLayers);
    (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar14;
    swapchainExtent =
         (VkExtent2D)
         GetSurfaceTransformString
                   ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform
                   );
    FormatString<char[7],char_const*,char[25]>
              ((string *)local_258,(Diligent *)"Using ",(char (*) [7])&swapchainExtent,
               (char **)" swap chain pretransform",(char (*) [25])in_R8);
    puVar4 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar24 = std::__cxx11::string::c_str();
      in_R8 = (char *)0x0;
      (*(code *)puVar4)(0,uVar24,0);
    }
    std::__cxx11::string::~string((string *)local_258);
  }
  memset(&local_268,0,8);
  if (((surfCapabilities.minImageCount == 0xffffffff) &&
      ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width != 0)) &&
     ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height != 0)) {
    puVar25 = std::max<unsigned_int>
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width,
                         &surfCapabilities.currentExtent.width);
    puVar25 = std::min<unsigned_int>(puVar25,&surfCapabilities.minImageExtent.width);
    _local_268 = CONCAT44(uStack_264,*puVar25);
    puVar25 = std::max<unsigned_int>
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height
                         ,&surfCapabilities.currentExtent.height);
    puVar25 = std::min<unsigned_int>(puVar25,&surfCapabilities.minImageExtent.height);
    uStack_264 = *puVar25;
  }
  else {
    local_268 = surfCapabilities.minImageCount;
    uStack_264 = surfCapabilities.maxImageCount;
  }
  PresentMode = VK_PRESENT_MODE_MAILBOX_KHR;
  puVar25 = std::max<unsigned_int>(&local_268,&PresentMode);
  _local_268 = CONCAT44(uStack_264,*puVar25);
  local_270 = 1;
  puVar25 = std::max<unsigned_int>(&uStack_264,&local_270);
  uVar1 = *puVar25;
  _local_268 = CONCAT44(uVar1,local_268);
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width = local_268;
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height = uVar1;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = VK_PRESENT_MODE_FIFO_KHR;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290);
  if ((this->m_VSyncEnabled & 1U) == 0) {
    local_2a0[1] = 1;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290,
               local_2a0 + 1);
    local_2a0[0] = VK_PRESENT_MODE_IMMEDIATE_KHR;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290,local_2a0);
    __range2_1._4_4_ = 2;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290,
               (value_type *)((long)&__range2_1 + 4));
  }
  else {
    local_2a0[3] = 3;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290,
               local_2a0 + 3);
    local_2a0[2] = 2;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290,
               local_2a0 + 2);
  }
  __end2_1 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::begin
                       ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290);
  iStack_2c0 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::end
                         ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290);
  while (bVar11 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffd40), bVar11) {
    pVVar26 = __gnu_cxx::
              __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
              ::operator*(&__end2_1);
    local_2c4 = *pVVar26;
    local_2d8._M_current =
         (VkPresentModeKHR *)
         std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::begin
                   ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8);
    local_2e0 = (VkPresentModeKHR *)
                std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::end
                          ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8)
    ;
    local_2d0 = std::
                find<__gnu_cxx::__normal_iterator<VkPresentModeKHR*,std::vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>>>,VkPresentModeKHR>
                          (local_2d8,
                           (__normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                            )local_2e0,&local_2c4);
    PresentModeName =
         (char *)std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::end
                           ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8
                           );
    bVar11 = __gnu_cxx::operator!=
                       (&local_2d0,
                        (__normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                         *)&PresentModeName);
    if (bVar11) {
      PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_2c4;
      break;
    }
    __gnu_cxx::
    __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
    ::operator++(&__end2_1);
  }
  if (PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == VK_PRESENT_MODE_IMMEDIATE_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_381969;
  }
  else if (PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == VK_PRESENT_MODE_MAILBOX_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_381980;
  }
  else if (PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == VK_PRESENT_MODE_FIFO_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_381997;
  }
  else if (PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == VK_PRESENT_MODE_FIFO_RELAXED_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_3819a2;
  }
  else if (PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ ==
           VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_3819b9;
  }
  else if (PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ ==
           VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR) {
    _msg_4.field_2._8_8_ = anon_var_dwarf_3819d0;
  }
  else {
    _msg_4.field_2._8_8_ = anon_var_dwarf_3819e7;
  }
  FormatString<char[7],char_const*,char[25]>
            ((string *)((long)&_msg_5.field_2 + 8),(Diligent *)"Using ",
             (char (*) [7])((long)&_msg_4.field_2 + 8),(char **)" swap chain present mode",
             (char (*) [25])in_R8);
  puVar4 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar24 = std::__cxx11::string::c_str();
    (*(code *)puVar4)(0,uVar24,0);
  }
  std::__cxx11::string::~string((string *)(_msg_5.field_2._M_local_buf + 8));
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_290);
  if (this->m_DesiredBufferCount < (uint)auStack_188._0_4_) {
    in_stack_fffffffffffff5b8 = (char (*) [71])auStack_188;
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)((long)&_msg_6.field_2 + 8),(Diligent *)"Desired back buffer count (",
               (char (*) [28])&this->m_DesiredBufferCount,
               (uint *)") is smaller than the minimal image count supported for this surface (",
               in_stack_fffffffffffff5b8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0);
    puVar4 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar24 = std::__cxx11::string::c_str();
      (*(code *)puVar4)(0,uVar24,0);
    }
    std::__cxx11::string::~string((string *)(_msg_6.field_2._M_local_buf + 8));
    this->m_DesiredBufferCount = auStack_188._0_4_;
  }
  if ((auStack_188._4_4_ != 0) && ((uint)auStack_188._4_4_ < this->m_DesiredBufferCount)) {
    in_stack_fffffffffffff5b8 = (char (*) [71])(auStack_188 + 4);
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)&compositeAlpha,(Diligent *)"Desired back buffer count (",
               (char (*) [28])&this->m_DesiredBufferCount,
               (uint *)") is greater than the maximal image count supported for this surface (",
               in_stack_fffffffffffff5b8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0);
    puVar4 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar24 = std::__cxx11::string::c_str();
      (*(code *)puVar4)(0,uVar24,0);
    }
    std::__cxx11::string::~string((string *)&compositeAlpha);
    this->m_DesiredBufferCount = auStack_188._4_4_;
  }
  compositeAlphaFlags[3] = this->m_DesiredBufferCount;
  compositeAlphaFlags[2] = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  _VStack_368 = 0x200000001;
  compositeAlphaFlags[0] = VK_COMPOSITE_ALPHA_POST_MULTIPLIED_BIT_KHR;
  compositeAlphaFlags[1] = VK_COMPOSITE_ALPHA_INHERIT_BIT_KHR;
  oldSwapchain._4_4_ = 0;
  do {
    if (3 < oldSwapchain._4_4_) {
LAB_0036f523:
      pVVar3 = this->m_VkSwapChain;
      this->m_VkSwapChain = (VkSwapchainKHR)0x0;
      memset((void *)((long)&msg_4.field_2 + 8),0,0x68);
      msg_4.field_2._8_4_ = 0x3b9acde8;
      if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage ==
          SWAP_CHAIN_USAGE_NONE) {
        FormatString<char[34]>
                  ((string *)&LogicalDevice,(char (*) [34])"No swap chain usage flags defined");
        pCVar15 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar15,"CreateVulkanSwapChain",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
                   ,0x1b4);
        std::__cxx11::string::~string((string *)&LogicalDevice);
      }
      Diligent::operator&((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage,
                          SWAP_CHAIN_USAGE_RENDER_TARGET);
      Diligent::operator&((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage,
                          SWAP_CHAIN_USAGE_SHADER_RESOURCE);
      Diligent::operator&((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage,
                          SWAP_CHAIN_USAGE_INPUT_ATTACHMENT);
      Diligent::operator&((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage,
                          SWAP_CHAIN_USAGE_COPY_SOURCE);
      vkDevice = (VkDevice)
                 RenderDeviceVkImpl::GetLogicalDevice((RenderDeviceVkImpl *)PhysicalDevice);
      local_410 = RenderDeviceVkImpl::GetVkDevice((RenderDeviceVkImpl *)PhysicalDevice);
      VVar12 = (*vkCreateSwapchainKHR)
                         (local_410,(VkSwapchainCreateInfoKHR *)((long)&msg_4.field_2 + 8),
                          (VkAllocationCallbacks *)0x0,&this->m_VkSwapChain);
      if (VVar12 != VK_SUCCESS) {
        pcStack_418 = VulkanUtilities::VkResultToString(VVar12);
        in_stack_fffffffffffff5b8 = (char (*) [71])&stack0xfffffffffffffbe8;
        LogError<true,char[34],char[17],char_const*>
                  (false,"CreateVulkanSwapChain",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
                   ,0x1d3,(char (*) [34])"Failed to create Vulkan swapchain",
                   (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
      }
      if (pVVar3 != (VkSwapchainKHR)0x0) {
        (*vkDestroySwapchainKHR)(local_410,pVVar3,(VkAllocationCallbacks *)0x0);
      }
      local_41c = 0;
      Args_1_03 = (char (*) [24])0x0;
      VVar12 = (*vkGetSwapchainImagesKHR)(local_410,this->m_VkSwapChain,&local_41c,(VkImage *)0x0);
      if (VVar12 != VK_SUCCESS) {
        msg_5.field_2._8_8_ = VulkanUtilities::VkResultToString(VVar12);
        in_stack_fffffffffffff5b8 = (char (*) [71])((long)&msg_5.field_2 + 8);
        Args_1_03 = (char (*) [24])0x1de;
        LogError<true,char[41],char[17],char_const*>
                  (false,"CreateVulkanSwapChain",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
                   ,0x1de,(char (*) [41])"Failed to request swap chain image count",
                   (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff5b8);
      }
      if (local_41c == 0) {
        FormatString<char[26],char[24]>
                  ((string *)((long)&_msg_7.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"swapchainImageCount > 0",Args_1_03);
        pCVar15 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar15,"CreateVulkanSwapChain",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
                   ,0x1df);
        std::__cxx11::string::~string((string *)(_msg_7.field_2._M_local_buf + 8));
      }
      if (local_41c !=
          (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount) {
        FormatString<char[25],unsigned_int,char[12],unsigned_int,char[12]>
                  ((string *)local_468,(Diligent *)"Created swap chain with ",
                   (char (*) [25])&local_41c,(uint *)" images vs ",
                   (char (*) [12])
                   &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount,
                   (uint *)0xc55903,(char (*) [12])in_stack_fffffffffffff5b8);
        puVar4 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar24 = std::__cxx11::string::c_str();
          (*(code *)puVar4)(0,uVar24,0);
        }
        std::__cxx11::string::~string((string *)local_468);
        (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount = local_41c;
      }
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
      ::resize(&this->m_ImageAcquiredSemaphores,(ulong)local_41c);
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
      ::resize(&this->m_DrawCompleteSemaphores,(ulong)local_41c);
      for (SemaphoreCI._20_4_ = 0; (uint)SemaphoreCI._20_4_ < local_41c;
          SemaphoreCI._20_4_ = SemaphoreCI._20_4_ + 1) {
        auStack_488 = (undefined1  [8])0x9;
        SemaphoreCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        SemaphoreCI._4_4_ = 0;
        SemaphoreCI.pNext = (void *)0x0;
        std::__cxx11::stringstream::stringstream((stringstream *)(Name.field_2._M_local_buf + 8));
        poVar27 = std::operator<<(local_600,"Swap chain image acquired semaphore ");
        std::ostream::operator<<(poVar27,SemaphoreCI._20_4_);
        std::__cxx11::stringstream::str();
        pVVar7 = vkDevice;
        pcVar28 = (char *)std::__cxx11::string::c_str();
        VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                  ((SemaphoreWrapper *)local_648,(VulkanLogicalDevice *)pVVar7,
                   (VkSemaphoreCreateInfo *)auStack_488,pcVar28);
        pVVar9 = PhysicalDevice;
        pcVar28 = (char *)std::__cxx11::string::c_str();
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
        ::operator[](&this->m_ImageAcquiredSemaphores,(ulong)(uint)SemaphoreCI._20_4_);
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::operator&((RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                     *)&local_658);
        ppMVar29 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_ManagedVulkanObject__
                             ((DoublePtrHelper *)&local_658);
        ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
        ::Create((RenderDeviceVkImpl *)pVVar9,
                 (VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17> *)
                 local_648,pcVar28,ppMVar29);
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::
        DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::~DoublePtrHelper(&local_658);
        VulkanUtilities::
        VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
        ~VulkanObjectWrapper
                  ((VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17> *)
                   local_648);
        std::__cxx11::string::~string((string *)&Semaphore.m_VkObject);
        std::__cxx11::stringstream::~stringstream((stringstream *)(Name.field_2._M_local_buf + 8));
        std::__cxx11::stringstream::stringstream((stringstream *)(Name_1.field_2._M_local_buf + 8));
        poVar27 = std::operator<<(local_7d0,"Swap chain draw complete semaphore ");
        std::ostream::operator<<(poVar27,SemaphoreCI._20_4_);
        std::__cxx11::stringstream::str();
        pVVar7 = vkDevice;
        pcVar28 = (char *)std::__cxx11::string::c_str();
        VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                  ((SemaphoreWrapper *)local_818,(VulkanLogicalDevice *)pVVar7,
                   (VkSemaphoreCreateInfo *)auStack_488,pcVar28);
        pVVar9 = PhysicalDevice;
        pcVar28 = (char *)std::__cxx11::string::c_str();
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
        ::operator[](&this->m_DrawCompleteSemaphores,(ulong)(uint)SemaphoreCI._20_4_);
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::operator&((RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                     *)&local_828);
        ppMVar29 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_ManagedVulkanObject__
                             ((DoublePtrHelper *)&local_828);
        ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
        ::Create((RenderDeviceVkImpl *)pVVar9,
                 (VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17> *)
                 local_818,pcVar28,ppMVar29);
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::
        DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::~DoublePtrHelper(&local_828);
        VulkanUtilities::
        VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
        ~VulkanObjectWrapper
                  ((VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17> *)
                   local_818);
        std::__cxx11::string::~string((string *)&Semaphore_1.m_VkObject);
        std::__cxx11::stringstream::~stringstream((stringstream *)(Name_1.field_2._M_local_buf + 8))
        ;
      }
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_1d8);
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~vector
                ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_80);
      return;
    }
    if ((surfCapabilities.supportedTransforms & (&VStack_368)[oldSwapchain._4_4_]) != 0) {
      compositeAlphaFlags[2] = (&VStack_368)[oldSwapchain._4_4_];
      goto LAB_0036f523;
    }
    oldSwapchain._4_4_ = oldSwapchain._4_4_ + 1;
  } while( true );
}

Assistant:

void SwapChainVkImpl::CreateVulkanSwapChain()
{
    RenderDeviceVkImpl*                          pRenderDeviceVk = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    VkPhysicalDevice                             vkDeviceHandle  = PhysicalDevice.GetVkDeviceHandle();
    // Get the list of VkFormats that are supported:
    uint32_t formatCount = 0;

    VkResult err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query number of supported formats");
    VERIFY_EXPR(formatCount > 0);
    std::vector<VkSurfaceFormatKHR> SupportedFormats(formatCount);
    err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, SupportedFormats.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query supported format properties");
    VERIFY_EXPR(formatCount == SupportedFormats.size());
    m_VkColorFormat = TexFormatToVkFormat(m_SwapChainDesc.ColorBufferFormat);

    VkColorSpaceKHR ColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    if (formatCount == 1 && SupportedFormats[0].format == VK_FORMAT_UNDEFINED)
    {
        // If the format list includes just one entry of VK_FORMAT_UNDEFINED,
        // the surface has no preferred format.  Otherwise, at least one
        // supported format will be returned.

        // Do nothing
    }
    else
    {
        bool FmtFound = false;
        for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
        {
            if (SrfFmt.format == m_VkColorFormat)
            {
                FmtFound   = true;
                ColorSpace = SrfFmt.colorSpace;
                break;
            }
        }
        if (!FmtFound)
        {
            VkFormat VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
            switch (m_VkColorFormat)
            {
                    // clang-format off
                case VK_FORMAT_R8G8B8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_SRGB;  break;
                case VK_FORMAT_R8G8B8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_SRGB;  break;
                default: VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
                    // clang-format on
            }

            bool ReplacementFmtFound = false;
            for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
            {
                if (SrfFmt.format == VkReplacementColorFormat)
                {
                    ReplacementFmtFound = true;
                    ColorSpace          = SrfFmt.colorSpace;
                    break;
                }
            }

            if (ReplacementFmtFound)
            {
                m_VkColorFormat                     = VkReplacementColorFormat;
                TEXTURE_FORMAT NewColorBufferFormat = VkFormatToTexFormat(VkReplacementColorFormat);
                LOG_INFO_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, " is not supported by the surface and will be replaced with ", GetTextureFormatAttribs(NewColorBufferFormat).Name);
                m_SwapChainDesc.ColorBufferFormat = NewColorBufferFormat;
            }
            else
            {
                LOG_WARNING_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, "is not supported by the surface");
            }
        }
    }

    VkSurfaceCapabilitiesKHR surfCapabilities = {};

    err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query physical device surface capabilities");

    uint32_t presentModeCount = 0;

    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present mode count");
    VERIFY_EXPR(presentModeCount > 0);
    std::vector<VkPresentModeKHR> presentModes(presentModeCount);
    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, presentModes.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present modes");
    VERIFY_EXPR(presentModeCount == presentModes.size());


    VkSurfaceTransformFlagBitsKHR vkPreTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL)
    {
        vkPreTransform = SurfaceTransformToVkSurfaceTransformFlag(m_DesiredPreTransform);
        if ((surfCapabilities.supportedTransforms & vkPreTransform) != 0)
        {
            m_SwapChainDesc.PreTransform = m_DesiredPreTransform;
        }
        else
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                                " is not supported by the presentation engine. Optimal surface transform will be used instead."
                                " Query the swap chain description to get the actual surface transform.");
            m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
        }
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        // Use current surface transform to avoid extra cost of presenting the image.
        // If preTransform does not match the currentTransform value returned by vkGetPhysicalDeviceSurfaceCapabilitiesKHR,
        // the presentation engine will transform the image content as part of the presentation operation.
        // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/appropriate-use-of-surface-rotation
        vkPreTransform               = surfCapabilities.currentTransform;
        m_SwapChainDesc.PreTransform = VkSurfaceTransformFlagToSurfaceTransform(vkPreTransform);
        LOG_INFO_MESSAGE("Using ", GetSurfaceTransformString(m_SwapChainDesc.PreTransform), " swap chain pretransform");
    }

    VkExtent2D swapchainExtent = {};
    // width and height are either both 0xFFFFFFFF, or both not 0xFFFFFFFF.
    if (surfCapabilities.currentExtent.width == 0xFFFFFFFF && m_SwapChainDesc.Width != 0 && m_SwapChainDesc.Height != 0)
    {
        // If the surface size is undefined, the size is set to
        // the size of the images requested.
        swapchainExtent.width  = std::min(std::max(m_SwapChainDesc.Width, surfCapabilities.minImageExtent.width), surfCapabilities.maxImageExtent.width);
        swapchainExtent.height = std::min(std::max(m_SwapChainDesc.Height, surfCapabilities.minImageExtent.height), surfCapabilities.maxImageExtent.height);
    }
    else
    {
        // If the surface size is defined, the swap chain size must match
        swapchainExtent = surfCapabilities.currentExtent;
    }

#if PLATFORM_ANDROID
    // On Android, vkGetPhysicalDeviceSurfaceCapabilitiesKHR is not reliable and starts reporting incorrect
    // dimensions after few rotations. To alleviate the problem, we store the surface extent corresponding to
    // identity rotation.
    // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
    if (m_SurfaceIdentityExtent.width == 0 || m_SurfaceIdentityExtent.height == 0)
    {
        m_SurfaceIdentityExtent = surfCapabilities.currentExtent;
        constexpr auto Rotate90TransformFlags =
            VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;
        if ((surfCapabilities.currentTransform & Rotate90TransformFlags) != 0)
            std::swap(m_SurfaceIdentityExtent.width, m_SurfaceIdentityExtent.height);
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        swapchainExtent = m_SurfaceIdentityExtent;
    }
    m_CurrentSurfaceTransform = surfCapabilities.currentTransform;
#endif

    swapchainExtent.width  = std::max(swapchainExtent.width, 1u);
    swapchainExtent.height = std::max(swapchainExtent.height, 1u);
    m_SwapChainDesc.Width  = swapchainExtent.width;
    m_SwapChainDesc.Height = swapchainExtent.height;

    // The FIFO present mode is guaranteed by the spec to always be supported.
    VkPresentModeKHR PresentMode = VK_PRESENT_MODE_FIFO_KHR;
    {
        std::vector<VkPresentModeKHR> PreferredPresentModes;
        if (m_VSyncEnabled)
        {
            // FIFO relaxed waits for the next VSync, but if the frame is late,
            // it still shows it even if VSync has already passed, which may
            // result in tearing.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_RELAXED_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }
        else
        {
            // Mailbox is the lowest latency non-tearing presentation mode.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_IMMEDIATE_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }

        for (VkPresentModeKHR PreferredMode : PreferredPresentModes)
        {
            if (std::find(presentModes.begin(), presentModes.end(), PreferredMode) != presentModes.end())
            {
                PresentMode = PreferredMode;
                break;
            }
        }

        const char* PresentModeName = nullptr;
#define PRESENT_MODE_CASE(Mode) \
    case Mode: PresentModeName = #Mode; break;
        switch (PresentMode)
        {
            PRESENT_MODE_CASE(VK_PRESENT_MODE_IMMEDIATE_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_MAILBOX_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_RELAXED_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR)
            default: PresentModeName = "<UNKNOWN>";
        }
#undef PRESENT_MODE_CASE
        LOG_INFO_MESSAGE("Using ", PresentModeName, " swap chain present mode");
    }

    // Determine the number of VkImage's to use in the swap chain.
    // We need to acquire only 1 presentable image at at time.
    // Asking for minImageCount images ensures that we can acquire
    // 1 presentable image as long as we present it before attempting
    // to acquire another.
    if (m_DesiredBufferCount < surfCapabilities.minImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is smaller than the minimal image count supported for this surface (", surfCapabilities.minImageCount, "). Resetting to ", surfCapabilities.minImageCount);
        m_DesiredBufferCount = surfCapabilities.minImageCount;
    }
    if (surfCapabilities.maxImageCount != 0 && m_DesiredBufferCount > surfCapabilities.maxImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is greater than the maximal image count supported for this surface (", surfCapabilities.maxImageCount, "). Resetting to ", surfCapabilities.maxImageCount);
        m_DesiredBufferCount = surfCapabilities.maxImageCount;
    }
    // We must use m_DesiredBufferCount instead of m_SwapChainDesc.BufferCount, because Vulkan on Android
    // may decide to always add extra buffers, causing infinite growth of the swap chain when it is recreated:
    //                          m_SwapChainDesc.BufferCount
    // CreateVulkanSwapChain()          2 -> 4
    // CreateVulkanSwapChain()          4 -> 6
    // CreateVulkanSwapChain()          6 -> 8
    uint32_t desiredNumberOfSwapChainImages = m_DesiredBufferCount;

    // Find a supported composite alpha mode - one of these is guaranteed to be set
    VkCompositeAlphaFlagBitsKHR compositeAlpha         = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    VkCompositeAlphaFlagBitsKHR compositeAlphaFlags[4] = //
        {
            VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR,
            VK_COMPOSITE_ALPHA_PRE_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_POST_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_INHERIT_BIT_KHR,
        };
    for (uint32_t i = 0; i < _countof(compositeAlphaFlags); i++)
    {
        if (surfCapabilities.supportedCompositeAlpha & compositeAlphaFlags[i])
        {
            compositeAlpha = compositeAlphaFlags[i];
            break;
        }
    }

    VkSwapchainKHR oldSwapchain = m_VkSwapChain;
    m_VkSwapChain               = VK_NULL_HANDLE;

    VkSwapchainCreateInfoKHR swapchain_ci = {};

    swapchain_ci.sType              = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    swapchain_ci.pNext              = NULL;
    swapchain_ci.surface            = m_VkSurface;
    swapchain_ci.minImageCount      = desiredNumberOfSwapChainImages;
    swapchain_ci.imageFormat        = m_VkColorFormat;
    swapchain_ci.imageExtent.width  = swapchainExtent.width;
    swapchain_ci.imageExtent.height = swapchainExtent.height;
    swapchain_ci.preTransform       = vkPreTransform;
    swapchain_ci.compositeAlpha     = compositeAlpha;
    swapchain_ci.imageArrayLayers   = 1;
    swapchain_ci.presentMode        = PresentMode;
    swapchain_ci.oldSwapchain       = oldSwapchain;
    swapchain_ci.clipped            = VK_TRUE;
    swapchain_ci.imageColorSpace    = ColorSpace;

    DEV_CHECK_ERR(m_SwapChainDesc.Usage != 0, "No swap chain usage flags defined");
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Please update this function to handle the new swapchain usage");
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_RENDER_TARGET)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_SHADER_RESOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_SAMPLED_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_COPY_SOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

    // vkCmdClearColorImage() command requires the image to use VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL layout
    // that requires  VK_IMAGE_USAGE_TRANSFER_DST_BIT to be set
    swapchain_ci.imageSharingMode      = VK_SHARING_MODE_EXCLUSIVE;
    swapchain_ci.queueFamilyIndexCount = 0;
    swapchain_ci.pQueueFamilyIndices   = NULL;
    //uint32_t queueFamilyIndices[] = { (uint32_t)info.graphics_queue_family_index, (uint32_t)info.present_queue_family_index };
    //if (info.graphics_queue_family_index != info.present_queue_family_index) {
    //    // If the graphics and present queues are from different queue families,
    //    // we either have to explicitly transfer ownership of images between
    //    // the queues, or we have to create the swapchain with imageSharingMode
    //    // as VK_SHARING_MODE_CONCURRENT
    //    swapchain_ci.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    //    swapchain_ci.queueFamilyIndexCount = 2;
    //    swapchain_ci.pQueueFamilyIndices = queueFamilyIndices;
    //}

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = pRenderDeviceVk->GetLogicalDevice();
    VkDevice                                    vkDevice      = pRenderDeviceVk->GetVkDevice();

    err = vkCreateSwapchainKHR(vkDevice, &swapchain_ci, NULL, &m_VkSwapChain);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan swapchain");

    if (oldSwapchain != VK_NULL_HANDLE)
    {
        vkDestroySwapchainKHR(vkDevice, oldSwapchain, NULL);
        oldSwapchain = VK_NULL_HANDLE;
    }

    uint32_t swapchainImageCount = 0;

    err = vkGetSwapchainImagesKHR(vkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to request swap chain image count");
    VERIFY_EXPR(swapchainImageCount > 0);
    if (swapchainImageCount != m_SwapChainDesc.BufferCount)
    {
        LOG_INFO_MESSAGE("Created swap chain with ", swapchainImageCount,
                         " images vs ", m_SwapChainDesc.BufferCount, " requested.");
        m_SwapChainDesc.BufferCount = swapchainImageCount;
    }

    m_ImageAcquiredSemaphores.resize(swapchainImageCount);
    m_DrawCompleteSemaphores.resize(swapchainImageCount);
    for (uint32_t i = 0; i < swapchainImageCount; ++i)
    {
        VkSemaphoreCreateInfo SemaphoreCI = {};

        SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
        SemaphoreCI.pNext = nullptr;
        SemaphoreCI.flags = 0; // reserved for future use

        {
            std::stringstream ss;
            ss << "Swap chain image acquired semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_ImageAcquiredSemaphores[i]);
        }

        {
            std::stringstream ss;
            ss << "Swap chain draw complete semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_DrawCompleteSemaphores[i]);
        }
    }
}